

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib517.c
# Opt level: O2

int test(char *URL)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  time_t *ptVar4;
  
  iVar3 = 0;
  for (ptVar4 = &dates[0].output; pcVar1 = ((dcheck *)(ptVar4 + -1))->input, pcVar1 != (char *)0x0;
      ptVar4 = ptVar4 + 2) {
    lVar2 = curl_getdate(pcVar1,0);
    if (lVar2 != *ptVar4) {
      curl_mprintf("WRONGLY %s => %ld (instead of %ld)\n",pcVar1,lVar2);
      iVar3 = iVar3 + 1;
    }
  }
  return iVar3;
}

Assistant:

int test(char *URL)
{
  int i;
  int error = 0;

  (void)URL; /* not used */

  for(i = 0; dates[i].input; i++) {
    time_t out = curl_getdate(dates[i].input, NULL);
    if(out != dates[i].output) {
      printf("WRONGLY %s => %ld (instead of %ld)\n",
             dates[i].input, out, dates[i].output);
      error++;
    }
  }

  return error;
}